

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpp_time.cpp
# Opt level: O0

void mpp_timer_set_timing(MppTimer timer,RK_S32 initial,RK_S32 interval)

{
  MPP_RET MVar1;
  MppTimerImpl *impl;
  RK_S32 interval_local;
  RK_S32 initial_local;
  MppTimer timer_local;
  
  if ((timer != (MppTimer)0x0) && (MVar1 = check_is_mpp_timer(timer), MVar1 == MPP_OK)) {
    *(RK_S32 *)((long)timer + 0x1c) = initial;
    *(RK_S32 *)((long)timer + 0x20) = interval;
    return;
  }
  _mpp_log_l(2,"mpp_time","invalid timer %p\n","mpp_timer_set_timing",timer);
  return;
}

Assistant:

void mpp_timer_set_timing(MppTimer timer, RK_S32 initial, RK_S32 interval)
{
    if (NULL == timer || check_is_mpp_timer(timer)) {
        mpp_err_f("invalid timer %p\n", timer);
        return ;
    }

    MppTimerImpl *impl = (MppTimerImpl *)timer;
    impl->initial = initial;
    impl->interval = interval;
}